

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O2

ssh2_userkey * ppk_load_s(BinarySource *src,char *passphrase,char **errorstr)

{
  BinarySink *bs;
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ptrlen pVar4;
  ptrlen pVar5;
  ptrlen passphrase_salt;
  _Bool _Var6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  strbuf *buf_o;
  char *pcVar11;
  ssh_keyalg *psVar12;
  ssh2_userkey *str;
  char *__s1;
  ushort **ppuVar13;
  strbuf *buf_o_00;
  ssh2_mac *psVar14;
  ssh_key *psVar15;
  ulong uVar16;
  ppk_cipher *ciphertype;
  ssh2_macalg *psVar17;
  char *pcVar18;
  byte *pbVar19;
  ssh2_userkey *psVar20;
  bool bVar21;
  ptrlen pVar22;
  strbuf *local_190;
  strbuf *local_188;
  strbuf *local_170;
  uint local_160;
  char header [40];
  ssh2_userkey *local_130;
  ppk_save_parameters params;
  ptrlen mackey;
  ptrlen cipheriv;
  ptrlen cipherkey;
  uchar binary [32];
  char s [3];
  
  buf_o = strbuf_new();
  _Var6 = read_header(src,header);
  if (!_Var6) {
    pcVar18 = "no header line found in key file";
LAB_001206cd:
    psVar20 = (ssh2_userkey *)0x0;
    goto LAB_001207c1;
  }
  iVar7 = bcmp(header,"PuTTY-User-Key-File-3",0x16);
  if (iVar7 == 0) {
    local_160 = 3;
LAB_001206f1:
    bVar21 = false;
  }
  else {
    iVar8 = bcmp(header,"PuTTY-User-Key-File-2",0x16);
    if (iVar8 == 0) {
      local_160 = 2;
      goto LAB_001206f1;
    }
    iVar8 = bcmp(header,"PuTTY-User-Key-File-1",0x16);
    if (iVar8 != 0) {
      iVar7 = bcmp(header,"PuTTY-User-Key-File-",0x14);
      pcVar18 = "not a PuTTY SSH-2 private key";
      if (iVar7 == 0) {
        pcVar18 = "PuTTY key format too new";
      }
      goto LAB_001206cd;
    }
    local_160 = 1;
    old_keyfile_warning();
    bVar21 = true;
  }
  pcVar11 = read_body(src);
  pcVar18 = "file format error";
  if (pcVar11 != (char *)0x0) {
    psVar12 = find_pubkey_alg(pcVar11);
    safefree(pcVar11);
    if (psVar12 != (ssh_keyalg *)0x0) {
      _Var6 = read_header(src,header);
      if (((!_Var6) || (iVar8 = bcmp(header,"Encryption",0xb), iVar8 != 0)) ||
         (pcVar11 = read_body(src), pcVar11 == (char *)0x0)) goto LAB_001206cd;
      iVar8 = strcmp(pcVar11,"aes256-cbc");
      if (iVar8 == 0) {
        ciphertype = &ppk_cipher_aes256_cbc;
LAB_00120822:
        _Var6 = read_header(src,header);
        if (((!_Var6) || (header._0_8_ != 0x746e656d6d6f43)) ||
           (str = (ssh2_userkey *)read_body(src), str == (ssh2_userkey *)0x0)) goto LAB_001208f9;
        params.field_4 = (anon_union_4_2_2262d70e_for_ppk_save_parameters_4)0x0;
        params.argon2_parallelism = 0;
        params.salt = (uint8_t *)0x0;
        params.fmt_version = 0;
        params.argon2_flavour = Argon2d;
        params.argon2_mem = 0;
        params.argon2_passes_auto = false;
        params._13_3_ = 0;
        params.saltlen = 0;
        _Var6 = read_header(src,header);
        local_130 = (ssh2_userkey *)0x16153e;
        if ((!_Var6) || (iVar9 = bcmp(header,"Public-Lines",0xd), iVar9 != 0)) {
          local_190 = (strbuf *)0x0;
          local_188 = (strbuf *)0x0;
          local_170 = (strbuf *)0x0;
          psVar20 = (ssh2_userkey *)0x0;
          __s1 = (char *)0x0;
          goto LAB_001208e7;
        }
        pcVar18 = read_body(src);
        if (pcVar18 == (char *)0x0) {
LAB_00120ba9:
          local_188 = (strbuf *)0x0;
          local_170 = (strbuf *)0x0;
LAB_00120c0d:
          local_190 = (strbuf *)0x0;
          psVar20 = (ssh2_userkey *)0x0;
          __s1 = (char *)0x0;
LAB_001208e7:
          safefree(str);
          pcVar18 = (char *)local_130;
        }
        else {
          iVar9 = userkey_parse_line_counter(pcVar18);
          safefree(pcVar18);
          if (iVar9 < 0) goto LAB_00120ba9;
          local_170 = strbuf_new();
          _Var6 = read_blob(src,iVar9,local_170->binarysink_);
          if (!_Var6) {
LAB_00120c04:
            local_188 = (strbuf *)0x0;
            goto LAB_00120c0d;
          }
          if ((iVar7 == 0) && (ciphertype->keylen != 0)) {
            _Var6 = read_header(src,header);
            if ((_Var6) && (iVar9 = bcmp(header,"Key-Derivation",0xf), iVar9 == 0)) {
              pcVar18 = read_body(src);
              local_190._0_4_ = Argon2d;
              if (pcVar18 != (char *)0x0) {
                iVar9 = strcmp(pcVar18,"Argon2d");
                if (iVar9 != 0) {
                  iVar9 = strcmp(pcVar18,"Argon2i");
                  if (iVar9 == 0) {
                    local_190._0_4_ = Argon2i;
                  }
                  else {
                    iVar9 = strcmp(pcVar18,"Argon2id");
                    if (iVar9 != 0) {
LAB_00120c7d:
                      safefree(pcVar18);
                      goto LAB_00120c04;
                    }
                    local_190._0_4_ = Argon2id;
                  }
                }
                params.argon2_flavour = (Argon2Flavour)local_190;
                safefree(pcVar18);
                _Var6 = read_header(src,header);
                if (((_Var6) && (iVar9 = bcmp(header,"Argon2-Memory",0xe), iVar9 == 0)) &&
                   (pcVar18 = read_body(src), pcVar18 != (char *)0x0)) {
                  _Var6 = str_to_uint32_t(pcVar18,&params.argon2_mem);
                  safefree(pcVar18);
                  if (((_Var6) && (_Var6 = read_header(src,header), _Var6)) &&
                     ((iVar9 = bcmp(header,"Argon2-Passes",0xe), iVar9 == 0 &&
                      (pcVar18 = read_body(src), pcVar18 != (char *)0x0)))) {
                    _Var6 = str_to_uint32_t(pcVar18,&params.field_4.argon2_passes);
                    safefree(pcVar18);
                    if (((_Var6) && (_Var6 = read_header(src,header), _Var6)) &&
                       ((iVar9 = bcmp(header,"Argon2-Parallelism",0x13), iVar9 == 0 &&
                        (pcVar18 = read_body(src), pcVar18 != (char *)0x0)))) {
                      _Var6 = str_to_uint32_t(pcVar18,&params.argon2_parallelism);
                      safefree(pcVar18);
                      if ((((_Var6) && (_Var6 = read_header(src,header), _Var6)) &&
                          (iVar9 = bcmp(header,"Argon2-Salt",0xc), iVar9 == 0)) &&
                         (pcVar18 = read_body(src), pcVar18 != (char *)0x0)) {
                        pbVar19 = (byte *)(pcVar18 + 1);
                        while( true ) {
                          bVar1 = pbVar19[-1];
                          if ((ulong)bVar1 == 0) break;
                          ppuVar13 = __ctype_b_loc();
                          if ((*(byte *)((long)*ppuVar13 + (ulong)bVar1 * 2 + 1) & 0x10) == 0)
                          goto LAB_00120c7d;
                          bVar2 = *pbVar19;
                          if (((ulong)bVar2 == 0) ||
                             ((*(byte *)((long)*ppuVar13 + (ulong)bVar2 * 2 + 1) & 0x10) == 0))
                          goto LAB_00120c7d;
                          s[2] = '\0';
                          s[0] = bVar1;
                          s[1] = bVar2;
                          uVar16 = strtoul(s,(char **)0x0,0x10);
                          BinarySink_put_byte(buf_o->binarysink_,(uchar)uVar16);
                          pbVar19 = pbVar19 + 2;
                        }
                        safefree(pcVar18);
                        goto LAB_001209cb;
                      }
                    }
                  }
                }
              }
            }
            goto LAB_00120c04;
          }
LAB_001209cb:
          _Var6 = read_header(src,header);
          if (((!_Var6) || (iVar9 = bcmp(header,"Private-Lines",0xe), iVar9 != 0)) ||
             (pcVar18 = read_body(src), pcVar18 == (char *)0x0)) goto LAB_00120c04;
          iVar9 = userkey_parse_line_counter(pcVar18);
          safefree(pcVar18);
          if (iVar9 < 0) goto LAB_00120c04;
          local_188 = strbuf_new_nm();
          _Var6 = read_blob(src,iVar9,local_188->binarysink_);
          if (((!_Var6) || (_Var6 = read_header(src,header), !_Var6)) ||
             (((iVar9 = bcmp(header,"Private-MAC",0xc), iVar9 != 0 &&
               (iVar10 = bcmp(header,"Private-Hash",0xd), !bVar21 || iVar10 != 0)) ||
              (__s1 = read_body(src), __s1 == (char *)0x0)))) goto LAB_00120c0d;
          local_190 = strbuf_new();
          pcVar18 = "";
          if (passphrase != (char *)0x0) {
            pcVar18 = passphrase;
          }
          pVar22 = ptrlen_from_asciz(pcVar18);
          passphrase_salt.ptr = buf_o->u;
          passphrase_salt.len = buf_o->len;
          ssh2_ppk_derive_keys
                    (local_160,ciphertype,pVar22,local_190,&cipherkey,&cipheriv,&mackey,
                     passphrase_salt,&params);
          psVar20 = (ssh2_userkey *)0x0;
          if (local_188->len % ciphertype->blocklen != 0) goto LAB_001208e7;
          if (iVar8 == 0) {
            aes256_decrypt_pubkey(cipherkey.ptr,cipheriv.ptr,local_188->u,(int)local_188->len);
          }
          if (iVar7 == 0) {
            psVar17 = &ssh_hmac_sha256;
          }
          else {
            psVar17 = &ssh_hmac_sha1;
          }
          buf_o_00 = local_188;
          if (!bVar21) {
            buf_o_00 = strbuf_new_nm();
            bs = buf_o_00->binarysink_;
            BinarySink_put_stringz(bs,psVar12->ssh_id);
            BinarySink_put_stringz(bs,pcVar11);
            BinarySink_put_stringz(bs,(char *)str);
            BinarySink_put_string(bs,local_170->s,local_170->len);
            BinarySink_put_string(bs,local_188->s,local_188->len);
          }
          if (iVar9 == 0) {
            psVar14 = (*psVar17->new)(psVar17,(ssh_cipher *)0x0);
            (*psVar14->vt->setkey)(psVar14,mackey);
            (*psVar14->vt->start)(psVar14);
            BinarySink_put_data(psVar14->binarysink_,buf_o_00->s,buf_o_00->len);
            (*psVar14->vt->genresult)(psVar14,binary);
            (*psVar14->vt->free)(psVar14);
          }
          else {
            pVar22.ptr = buf_o_00->u;
            pVar22.len = buf_o_00->len;
            hash_simple(&ssh_sha1,pVar22,binary);
          }
          if (!bVar21) {
            strbuf_free(buf_o_00);
          }
          if (iVar7 == 0) {
            psVar17 = &ssh_hmac_sha256;
          }
          else {
            psVar17 = &ssh_hmac_sha1;
          }
          uVar3 = psVar17->len;
          if (psVar17->len < 1) {
            uVar3 = 0;
          }
          pcVar18 = s;
          for (uVar16 = 0; uVar3 != uVar16; uVar16 = uVar16 + 1) {
            sprintf(pcVar18,"%02x",(ulong)binary[uVar16]);
            pcVar18 = pcVar18 + 2;
          }
          iVar7 = strcmp(__s1,s);
          if (iVar7 != 0) {
            bVar21 = ciphertype->keylen == 0;
            local_130 = (ssh2_userkey *)0x161605;
            if (bVar21) {
              local_130 = (ssh2_userkey *)0x161616;
            }
            psVar20 = &ssh2_wrong_passphrase;
            if (bVar21) {
              psVar20 = (ssh2_userkey *)0x0;
            }
            goto LAB_001208e7;
          }
          pcVar18 = (char *)0x0;
          psVar20 = (ssh2_userkey *)safemalloc(1,0x10,0);
          psVar20->comment = (char *)str;
          pVar4.ptr = local_170->u;
          pVar4.len = local_170->len;
          pVar5.ptr = local_188->u;
          pVar5.len = local_188->len;
          psVar15 = (*psVar12->new_priv)(psVar12,pVar4,pVar5);
          psVar20->key = psVar15;
          if (psVar15 == (ssh_key *)0x0) {
            local_130 = (ssh2_userkey *)0x161621;
            str = psVar20;
            psVar20 = (ssh2_userkey *)pcVar18;
            goto LAB_001208e7;
          }
        }
      }
      else {
        iVar9 = strcmp(pcVar11,"none");
        if (iVar9 == 0) {
          ciphertype = &ppk_cipher_none;
          goto LAB_00120822;
        }
LAB_001208f9:
        local_190 = (strbuf *)0x0;
        local_188 = (strbuf *)0x0;
        local_170 = (strbuf *)0x0;
        psVar20 = (ssh2_userkey *)0x0;
        __s1 = (char *)0x0;
        pcVar18 = "file format error";
      }
      safefree(pcVar11);
      if (__s1 != (char *)0x0) {
        safefree(__s1);
      }
      if (local_170 != (strbuf *)0x0) {
        strbuf_free(local_170);
      }
      if (local_188 != (strbuf *)0x0) {
        strbuf_free(local_188);
      }
      if (local_190 != (strbuf *)0x0) {
        strbuf_free(local_190);
      }
      goto LAB_001207c1;
    }
  }
  psVar20 = (ssh2_userkey *)0x0;
LAB_001207c1:
  strbuf_free(buf_o);
  if (errorstr != (char **)0x0) {
    *errorstr = pcVar18;
  }
  return psVar20;
}

Assistant:

ssh2_userkey *ppk_load_s(BinarySource *src, const char *passphrase,
                         const char **errorstr)
{
    char header[40], *b, *encryption, *comment, *mac;
    const ssh_keyalg *alg;
    ssh2_userkey *ret;
    strbuf *public_blob, *private_blob, *cipher_mac_keys_blob;
    strbuf *passphrase_salt = strbuf_new();
    ptrlen cipherkey, cipheriv, mackey;
    const struct ppk_cipher *ciphertype;
    int i;
    bool is_mac;
    unsigned fmt_version;
    const char *error = NULL;
    ppk_save_parameters params;

    ret = NULL;                        /* return NULL for most errors */
    encryption = comment = mac = NULL;
    public_blob = private_blob = cipher_mac_keys_blob = NULL;

    /* Read the first header line which contains the key type. */
    if (!read_header(src, header)) {
        error = "no header line found in key file";
        goto error;
    }
    if (0 == strcmp(header, "PuTTY-User-Key-File-3")) {
        fmt_version = 3;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-2")) {
        fmt_version = 2;
    } else if (0 == strcmp(header, "PuTTY-User-Key-File-1")) {
        /* this is an old key file; warn and then continue */
        old_keyfile_warning();
        fmt_version = 1;
    } else if (0 == strncmp(header, "PuTTY-User-Key-File-", 20)) {
        /* this is a key file FROM THE FUTURE; refuse it, but with a
         * more specific error message than the generic one below */
        error = "PuTTY key format too new";
        goto error;
    } else {
        error = "not a PuTTY SSH-2 private key";
        goto error;
    }
    error = "file format error";
    if ((b = read_body(src)) == NULL)
        goto error;
    /* Select key algorithm structure. */
    alg = find_pubkey_alg(b);
    if (!alg) {
        sfree(b);
        goto error;
    }
    sfree(b);

    /* Read the Encryption header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Encryption"))
        goto error;
    if ((encryption = read_body(src)) == NULL)
        goto error;
    if (!strcmp(encryption, "aes256-cbc")) {
        ciphertype = &ppk_cipher_aes256_cbc;
    } else if (!strcmp(encryption, "none")) {
        ciphertype = &ppk_cipher_none;
    } else {
        goto error;
    }

    /* Read the Comment header line. */
    if (!read_header(src, header) || 0 != strcmp(header, "Comment"))
        goto error;
    if ((comment = read_body(src)) == NULL)
        goto error;

    memset(&params, 0, sizeof(params)); /* in particular, sets
                                         * passes_auto=false */

    /* Read the Public-Lines header line and the public blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Public-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    public_blob = strbuf_new();
    if (!read_blob(src, i, BinarySink_UPCAST(public_blob)))
        goto error;

    if (fmt_version >= 3 && ciphertype->keylen != 0) {
        /* Read Argon2 key derivation parameters. */
        if (!read_header(src, header) || 0 != strcmp(header, "Key-Derivation"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!strcmp(b, "Argon2d")) {
            params.argon2_flavour = Argon2d;
        } else if (!strcmp(b, "Argon2i")) {
            params.argon2_flavour = Argon2i;
        } else if (!strcmp(b, "Argon2id")) {
            params.argon2_flavour = Argon2id;
        } else {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Memory"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_mem)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Passes"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_passes)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) ||
            0 != strcmp(header, "Argon2-Parallelism"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        if (!str_to_uint32_t(b, &params.argon2_parallelism)) {
            sfree(b);
            goto error;
        }
        sfree(b);

        if (!read_header(src, header) || 0 != strcmp(header, "Argon2-Salt"))
            goto error;
        if ((b = read_body(src)) == NULL)
            goto error;
        for (size_t i = 0; b[i]; i += 2) {
            if (isxdigit((unsigned char)b[i]) && b[i+1] &&
                isxdigit((unsigned char)b[i+1])) {
                char s[3];
                s[0] = b[i];
                s[1] = b[i+1];
                s[2] = '\0';
                put_byte(passphrase_salt, strtoul(s, NULL, 16));
            } else {
                sfree(b);
                goto error;
            }
        }
        sfree(b);
    }

    /* Read the Private-Lines header line and the Private blob. */
    if (!read_header(src, header) || 0 != strcmp(header, "Private-Lines"))
        goto error;
    if ((b = read_body(src)) == NULL)
        goto error;
    i = userkey_parse_line_counter(b);
    sfree(b);
    if (i < 0)
        goto error;
    private_blob = strbuf_new_nm();
    if (!read_blob(src, i, BinarySink_UPCAST(private_blob)))
        goto error;

    /* Read the Private-MAC or Private-Hash header line. */
    if (!read_header(src, header))
        goto error;
    if (0 == strcmp(header, "Private-MAC")) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = true;
    } else if (0 == strcmp(header, "Private-Hash") && fmt_version == 1) {
        if ((mac = read_body(src)) == NULL)
            goto error;
        is_mac = false;
    } else
        goto error;

    cipher_mac_keys_blob = strbuf_new();
    ssh2_ppk_derive_keys(fmt_version, ciphertype,
                         ptrlen_from_asciz(passphrase ? passphrase : ""),
                         cipher_mac_keys_blob, &cipherkey, &cipheriv, &mackey,
                         ptrlen_from_strbuf(passphrase_salt), &params);

    /*
     * Decrypt the private blob.
     */
    if (private_blob->len % ciphertype->blocklen)
        goto error;
    if (ciphertype == &ppk_cipher_aes256_cbc) {
        aes256_decrypt_pubkey(cipherkey.ptr, cipheriv.ptr,
                              private_blob->u, private_blob->len);
    }

    /*
     * Verify the MAC.
     */
    {
        unsigned char binary[32];
        char realmac[sizeof(binary) * 2 + 1];
        strbuf *macdata;
        bool free_macdata;

        const ssh2_macalg *mac_alg =
            fmt_version <= 2 ? &ssh_hmac_sha1 : &ssh_hmac_sha256;

        if (fmt_version == 1) {
            /* MAC (or hash) only covers the private blob. */
            macdata = private_blob;
            free_macdata = false;
        } else {
            macdata = strbuf_new_nm();
            put_stringz(macdata, alg->ssh_id);
            put_stringz(macdata, encryption);
            put_stringz(macdata, comment);
            put_string(macdata, public_blob->s,
                       public_blob->len);
            put_string(macdata, private_blob->s,
                       private_blob->len);
            free_macdata = true;
        }

        if (is_mac) {
            ssh2_mac *mac;

            mac = ssh2_mac_new(mac_alg, NULL);
            ssh2_mac_setkey(mac, mackey);
            ssh2_mac_start(mac);
            put_data(mac, macdata->s, macdata->len);
            ssh2_mac_genresult(mac, binary);
            ssh2_mac_free(mac);
        } else {
            hash_simple(&ssh_sha1, ptrlen_from_strbuf(macdata), binary);
        }

        if (free_macdata)
            strbuf_free(macdata);

        for (i = 0; i < mac_alg->len; i++)
            sprintf(realmac + 2 * i, "%02x", binary[i]);

        if (strcmp(mac, realmac)) {
            /* An incorrect MAC is an unconditional Error if the key is
             * unencrypted. Otherwise, it means Wrong Passphrase. */
            if (ciphertype->keylen != 0) {
                error = "wrong passphrase";
                ret = SSH2_WRONG_PASSPHRASE;
            } else {
                error = "MAC failed";
                ret = NULL;
            }
            goto error;
        }
    }

    /*
     * Create and return the key.
     */
    ret = snew(ssh2_userkey);
    ret->comment = comment;
    comment = NULL;
    ret->key = ssh_key_new_priv(
        alg, ptrlen_from_strbuf(public_blob),
        ptrlen_from_strbuf(private_blob));
    if (!ret->key) {
        sfree(ret);
        ret = NULL;
        error = "createkey failed";
        goto error;
    }
    error = NULL;

    /*
     * Error processing.
     */
  error:
    if (comment)
        sfree(comment);
    if (encryption)
        sfree(encryption);
    if (mac)
        sfree(mac);
    if (public_blob)
        strbuf_free(public_blob);
    if (private_blob)
        strbuf_free(private_blob);
    if (cipher_mac_keys_blob)
        strbuf_free(cipher_mac_keys_blob);
    strbuf_free(passphrase_salt);
    if (errorstr)
        *errorstr = error;
    return ret;
}